

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::convert_etc1s_to_etc2_eac_a8
               (eac_block *pDst_block,endpoint *pEndpoints,selector *pSelector)

{
  byte *pbVar1;
  long in_RDX;
  byte *in_RSI;
  eac_block *in_RDI;
  uint32_t dst_ofs;
  uint32_t ds;
  uint32_t s;
  uint32_t x;
  uint32_t y;
  uint64_t selector_bits;
  etc1_g_to_eac_conversion *pTable_entry;
  uint32_t selector_range_table;
  uint32_t r;
  uint32_t inten_table;
  color32 *base_color;
  uint32_t high_selector;
  uint32_t low_selector;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar3;
  uint64_t local_48;
  uint local_34;
  ushort local_30;
  
  if ((uint)*(byte *)(in_RDX + 8) == (uint)*(byte *)(in_RDX + 9)) {
    decoder_etc_block::get_block_color5_r
              ((color32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
               (uint32_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    *(ushort *)in_RDI = *(ushort *)in_RDI & 0xff00 | local_30 & 0xff;
    *(ushort *)in_RDI = *(ushort *)in_RDI & 0xf0ff | 0xd00;
    *(ushort *)in_RDI = *(ushort *)in_RDI & 0xfff | 0x1000;
    in_RDI->m_selectors[0] = 0x92;
    in_RDI->m_selectors[1] = 'I';
    in_RDI->m_selectors[2] = '$';
    in_RDI->m_selectors[3] = 0x92;
    in_RDI->m_selectors[4] = 'I';
    in_RDI->m_selectors[5] = '$';
  }
  else {
    local_34 = 0;
    while ((local_34 < 4 &&
           (((uint)*(byte *)(in_RDX + 8) !=
             *(uint *)(s_etc2_eac_selector_ranges + (ulong)local_34 * 8) ||
            ((uint)*(byte *)(in_RDX + 9) !=
             *(uint *)(s_etc2_eac_selector_ranges + (ulong)local_34 * 8 + 4)))))) {
      local_34 = local_34 + 1;
    }
    if (3 < local_34) {
      local_34 = 0;
    }
    pbVar1 = s_etc1_g_to_etc2_a8 +
             (ulong)local_34 * 4 + (ulong)((uint)*in_RSI + (uint)in_RSI[4] * 0x20) * 0x10;
    *(ushort *)in_RDI = *(ushort *)in_RDI & 0xff00 | (ushort)*pbVar1;
    *(ushort *)in_RDI = *(ushort *)in_RDI & 0xf0ff | (short)((int)(uint)pbVar1[1] >> 4) << 8;
    *(ushort *)in_RDI = *(ushort *)in_RDI & 0xfff | (ushort)pbVar1[1] << 0xc;
    local_48 = 0;
    for (uVar3 = 0; uVar3 < 4; uVar3 = uVar3 + 1) {
      for (uVar2 = 0; uVar2 < 4; uVar2 = uVar2 + 1) {
        in_stack_ffffffffffffffac =
             selector::get_selector
                       ((selector *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffffac,
                        in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffa8 =
             (int)(uint)*(ushort *)(pbVar1 + 2) >>
             ((char)in_stack_ffffffffffffffac * '\x03' & 0x1fU) & 7;
        local_48 = (ulong)in_stack_ffffffffffffffa8 <<
                   (((char)uVar3 + (char)uVar2 * '\x04') * -3 + 0x2dU & 0x3f) | local_48;
      }
    }
    eac_block::set_selector_bits(in_RDI,local_48);
  }
  return;
}

Assistant:

static void convert_etc1s_to_etc2_eac_a8(eac_block* pDst_block, const endpoint* pEndpoints, const selector* pSelector)
	{
		const uint32_t low_selector = pSelector->m_lo_selector;
		const uint32_t high_selector = pSelector->m_hi_selector;

		const color32& base_color = pEndpoints->m_color5;
		const uint32_t inten_table = pEndpoints->m_inten5;

		if (low_selector == high_selector)
		{
			uint32_t r;
			decoder_etc_block::get_block_color5_r(base_color, inten_table, low_selector, r);

			// Constant alpha block
			// Select table 13, use selector 4 (0), set multiplier to 1 and base color g
			pDst_block->m_base = r;
			pDst_block->m_table = 13;
			pDst_block->m_multiplier = 1;

			// selectors are all 4's
			memcpy(pDst_block->m_selectors, g_etc2_eac_a8_sel4, sizeof(g_etc2_eac_a8_sel4));

			return;
		}

		uint32_t selector_range_table = 0;
		for (selector_range_table = 0; selector_range_table < NUM_ETC2_EAC_SELECTOR_RANGES; selector_range_table++)
			if ((low_selector == s_etc2_eac_selector_ranges[selector_range_table].m_low) && (high_selector == s_etc2_eac_selector_ranges[selector_range_table].m_high))
				break;
		if (selector_range_table >= NUM_ETC2_EAC_SELECTOR_RANGES)
			selector_range_table = 0;

		const etc1_g_to_eac_conversion* pTable_entry = &s_etc1_g_to_etc2_a8[base_color.r + inten_table * 32][selector_range_table];

		pDst_block->m_base = pTable_entry->m_base;
		pDst_block->m_table = pTable_entry->m_table_mul >> 4;
		pDst_block->m_multiplier = pTable_entry->m_table_mul & 15;

		uint64_t selector_bits = 0;

		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				uint32_t s = pSelector->get_selector(x, y);

				uint32_t ds = (pTable_entry->m_trans >> (s * 3)) & 7;

				const uint32_t dst_ofs = 45 - (y + x * 4) * 3;
				selector_bits |= (static_cast<uint64_t>(ds) << dst_ofs);
			}
		}

		pDst_block->set_selector_bits(selector_bits);
	}